

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.h
# Opt level: O1

unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
__thiscall wabt::WastLexer::MakeLineFinder(WastLexer *this)

{
  undefined8 *in_RSI;
  __uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> local_20;
  
  (**(code **)(*(long *)*in_RSI + 0x10))(&local_20);
  MakeUnique<wabt::LexerSourceLineFinder,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>>
            ((wabt *)this,
             (unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)&local_20);
  if (local_20._M_t.
      super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
      super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                          .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl + 8))();
  }
  return (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
          )(__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<LexerSourceLineFinder> MakeLineFinder() {
    return MakeUnique<LexerSourceLineFinder>(source_->Clone());
  }